

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

void __thiscall soul::TaskThread::run(TaskThread *this)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  byte bVar5;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_48;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  if ((this->shuttingDown).super___atomic_base<int>._M_i == 0) {
    do {
      local_48._M_owns = false;
      local_48._M_device = &this->queueLock;
      std::unique_lock<std::mutex>::lock(&local_48);
      local_48._M_owns = true;
      if ((this->queues).
          super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          (this->queues).
          super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
LAB_002725db:
        lVar3 = std::chrono::_V2::steady_clock::now();
        local_38.__d.__r = (duration)(lVar3 + 500000000);
        std::condition_variable::
        __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  (&this->checkQueues,&local_48,&local_38);
      }
      else {
        uVar4 = 0;
        bVar1 = 0;
        do {
          bVar5 = bVar1;
          if ((this->shuttingDown).super___atomic_base<int>._M_i != 0) {
            std::unique_lock<std::mutex>::~unique_lock(&local_48);
            return;
          }
          bVar2 = Queue::serviceNextTask
                            ((this->queues).
                             super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4]);
          uVar4 = uVar4 + 1;
          bVar1 = bVar5 | bVar2;
        } while (uVar4 < (ulong)((long)(this->queues).
                                       super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->queues).
                                       super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        if (bVar5 == 0 && !bVar2) goto LAB_002725db;
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
    } while ((this->shuttingDown).super___atomic_base<int>._M_i == 0);
  }
  return;
}

Assistant:

void addActiveSession (SessionImpl& session)
    {
        std::lock_guard<std::mutex> l (sessionListLock);
        activeSessions.push_back (std::addressof (session));
    }